

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O2

int IDASetStepToleranceIC(void *ida_mem,sunrealtype steptol)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x35d;
  }
  else {
    if (0.0 < steptol) {
      *(sunrealtype *)((long)ida_mem + 0x498) = steptol;
      return 0;
    }
    msgfmt = "steptol <= 0.0 illegal.";
    error_code = -0x16;
    line = 0x365;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDASetStepToleranceIC",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDASetStepToleranceIC(void* ida_mem, sunrealtype steptol)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (steptol <= ZERO)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_STEPTOL);
    return (IDA_ILL_INPUT);
  }

  IDA_mem->ida_steptol = steptol;

  return (IDA_SUCCESS);
}